

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

GlobalFederateId __thiscall helics::TimeDependencies::getMinDependency(TimeDependencies *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DependencyInfo *dep;
  pointer pDVar4;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range1;
  long lVar5;
  long lVar6;
  
  iVar3 = -2010000000;
  lVar5 = 0x7fffffffffffffff;
  for (pDVar4 = (this->dependencies).
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pDVar4 != (this->dependencies).
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish; pDVar4 = pDVar4 + 1) {
    lVar6 = lVar5;
    iVar2 = iVar3;
    if (((pDVar4->dependency == true) &&
        (iVar1 = (pDVar4->fedID).gid, iVar1 - 0x20000U < 0x6ffe0000)) &&
       (lVar6 = (pDVar4->super_TimeData).next.internalTimeCode, iVar2 = iVar1,
       lVar6 == 0x7fffffffffffffff || lVar5 <= lVar6)) {
      lVar6 = lVar5;
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    lVar5 = lVar6;
  }
  return (GlobalFederateId)iVar3;
}

Assistant:

GlobalFederateId TimeDependencies::getMinDependency() const
{
    GlobalFederateId minID;
    Time minTime(Time::maxVal());
    for (const auto& dep : dependencies) {
        if (dep.dependency && (dep.fedID.isFederate()) && (dep.next < cBigTime)) {
            if (dep.next < minTime) {
                minTime = dep.next;
                minID = dep.fedID;
            }
        }
    }
    return minID;
}